

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::reassign
          (WorkData *this,uint32_t varId,uint32_t newId,uint32_t oldId)

{
  bool bVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  WorkData *in_RDI;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  uint32_t in_stack_ffffffffffffffbc;
  
  bVar1 = isAssigned(in_RDI,in_stack_ffffffffffffffbc);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  bVar1 = isAssigned(in_RDI,in_stack_ffffffffffffffbc);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  if (in_RDI->_physToVarId[in_ECX] != in_ESI) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  if (in_RDI->_physToVarId[in_EDX] != 0xff) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  in_RDI->_physToVarId[in_ECX] = 0xff;
  in_RDI->_physToVarId[in_EDX] = (uint8_t)in_ESI;
  in_RDI->_assignedRegs =
       1 << ((byte)in_EDX & 0x1f) ^ 1 << ((byte)in_ECX & 0x1f) ^ in_RDI->_assignedRegs;
  return;
}

Assistant:

inline void reassign(uint32_t varId, uint32_t newId, uint32_t oldId) noexcept {
      ASMJIT_ASSERT( isAssigned(oldId));
      ASMJIT_ASSERT(!isAssigned(newId));
      ASMJIT_ASSERT(_physToVarId[oldId] == varId);
      ASMJIT_ASSERT(_physToVarId[newId] == kVarIdNone);

      _physToVarId[oldId] = uint8_t(kVarIdNone);
      _physToVarId[newId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(newId) ^ Support::bitMask(oldId);
    }